

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

Offset<const_flatbuffers::Table_*>
flatbuffers::CopyTable
          (FlatBufferBuilder *fbb,Schema *schema,Object *objectdef,Table *table,
          bool use_string_pooling)

{
  uint *puVar1;
  uint8_t **ppuVar2;
  Object *pOVar3;
  FlatBufferBuilder *pFVar4;
  bool use_string_pooling_00;
  ushort uVar5;
  voffset_t field;
  uint uVar6;
  Offset<flatbuffers::String> OVar7;
  Offset<const_flatbuffers::Table_*> OVar8;
  uoffset_t uVar9;
  long lVar10;
  Field *pFVar11;
  ulong uVar12;
  long lVar13;
  Object *pOVar14;
  size_t sVar15;
  Field *pFVar16;
  long lVar17;
  Schema *pSVar18;
  Table *pTVar19;
  Table *pTVar20;
  pointer pOVar21;
  ulong uVar22;
  ushort uVar23;
  uint8_t *__dest;
  long lVar24;
  int iVar25;
  uint uVar26;
  undefined7 in_register_00000081;
  Schema *pSVar27;
  size_t sVar28;
  ushort uVar29;
  Object *pOVar30;
  ulong uVar31;
  long lVar32;
  uoffset_t offset;
  vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
  elements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  uint local_a8;
  allocator_type local_a1;
  Schema *local_a0;
  Object *local_98;
  FlatBufferBuilder *local_90;
  undefined4 local_84;
  vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
  local_80;
  void *local_68;
  iterator iStack_60;
  uint *local_58;
  Object *local_50;
  Table *local_48;
  Object *local_40;
  Object *local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000081,use_string_pooling);
  local_68 = (void *)0x0;
  iStack_60._M_current = (uint *)0x0;
  local_58 = (uint *)0x0;
  if (*(ushort *)(objectdef + -(long)*(int *)objectdef) < 7) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(objectdef + (6 - (long)*(int *)objectdef));
  }
  if (uVar5 == 0) {
    pOVar30 = (Object *)0x0;
  }
  else {
    pOVar30 = objectdef + (ulong)*(uint *)(objectdef + uVar5) + (ulong)uVar5;
  }
  pOVar14 = pOVar30 + 4;
  local_a0 = schema;
  local_98 = pOVar30;
  local_90 = fbb;
  local_50 = objectdef;
  local_40 = pOVar14;
  if ((*(uint *)pOVar30 & 0x3fffffff) != 0) {
    do {
      pOVar3 = local_98;
      pFVar11 = (Field *)(pOVar14 + *(uint *)pOVar14);
      if (*(ushort *)(pFVar11 + -(long)*(int *)(pOVar14 + *(uint *)pOVar14)) < 0xb) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(pFVar11 + (10 - (long)*(int *)(pOVar14 + *(uint *)pOVar14)));
      }
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(pFVar11 + uVar5);
      }
      lVar13 = (long)*(int *)table;
      uVar23 = *(ushort *)(table + -lVar13);
      local_38 = pOVar14;
      if ((uVar5 < uVar23) && (*(short *)(table + ((ulong)uVar5 - lVar13)) != 0)) {
        local_a8 = 0;
        lVar10 = -(long)*(int *)pFVar11;
        uVar5 = *(ushort *)(pFVar11 + -(long)*(int *)pFVar11);
        if (uVar5 < 7) {
          uVar29 = 0;
        }
        else {
          uVar29 = *(ushort *)(pFVar11 + lVar10 + 6);
        }
        if (uVar29 == 0) {
          pFVar16 = (Field *)0x0;
        }
        else {
          pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar29) + (ulong)uVar29;
        }
        iVar25 = 0;
        uVar29 = 0;
        if (4 < *(ushort *)(pFVar16 + -(long)*(int *)pFVar16)) {
          uVar29 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
        }
        if (uVar29 != 0) {
          iVar25 = (int)(char)pFVar16[uVar29].super_Table;
        }
        use_string_pooling_00 = (bool)(char)local_84;
        switch(iVar25) {
        case 0xd:
          if ((bool)(char)local_84 == false) {
            if (uVar5 < 7) {
              uVar29 = 0;
            }
            else {
              uVar29 = *(ushort *)(pFVar11 + lVar10 + 6);
            }
            if (uVar29 == 0) {
              pFVar16 = (Field *)0x0;
            }
            else {
              pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar29) + (ulong)uVar29;
            }
            if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 5) {
              uVar29 = 0;
            }
            else {
              uVar29 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
            }
            if ((uVar29 == 0) || (pFVar16[uVar29].super_Table != (Table)0xd)) goto LAB_0014cb67;
            if (uVar5 < 0xb) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + lVar10 + 10);
            }
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + uVar5);
            }
            if (uVar5 < uVar23) {
              uVar5 = *(ushort *)(table + ((ulong)uVar5 - lVar13));
            }
            else {
              uVar5 = 0;
            }
            if (uVar5 == 0) {
              pTVar19 = (Table *)0x0;
            }
            else {
              pTVar19 = table + (ulong)*(uint *)(table + uVar5) + (ulong)uVar5;
            }
            if (pTVar19 == (Table *)0x0) goto LAB_0014c490;
            FlatBufferBuilderImpl<false>::CreateStringImpl
                      (fbb,(char *)(pTVar19 + 4),(ulong)*(uint *)pTVar19);
            local_a8 = (fbb->buf_).size_;
          }
          else {
            if (uVar5 < 7) {
              uVar29 = 0;
            }
            else {
              uVar29 = *(ushort *)(pFVar11 + lVar10 + 6);
            }
            if (uVar29 == 0) {
              pFVar16 = (Field *)0x0;
            }
            else {
              pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar29) + (ulong)uVar29;
            }
            if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 5) {
              uVar29 = 0;
            }
            else {
              uVar29 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
            }
            if ((uVar29 == 0) || (pFVar16[uVar29].super_Table != (Table)0xd)) {
LAB_0014cb67:
              __assert_fail("field.type()->base_type() == reflection::String",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                            ,0x8b,
                            "const String *flatbuffers::GetFieldS(const Table &, const reflection::Field &)"
                           );
            }
            if (uVar5 < 0xb) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + lVar10 + 10);
            }
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + uVar5);
            }
            if (uVar5 < uVar23) {
              uVar5 = *(ushort *)(table + ((ulong)uVar5 - lVar13));
            }
            else {
              uVar5 = 0;
            }
            if (uVar5 == 0) {
              pTVar19 = (Table *)0x0;
            }
            else {
              pTVar19 = table + (ulong)*(uint *)(table + uVar5) + (ulong)uVar5;
            }
            if (pTVar19 == (Table *)0x0) {
LAB_0014c490:
              local_a8 = 0;
            }
            else {
              local_a8 = (uint)FlatBufferBuilderImpl<false>::CreateSharedString
                                         (fbb,(char *)(pTVar19 + 4),(ulong)*(uint *)pTVar19);
            }
          }
          break;
        case 0xe:
          if (uVar5 < 0xb) {
            uVar29 = 0;
          }
          else {
            uVar29 = *(ushort *)(pFVar11 + lVar10 + 10);
          }
          if (uVar29 == 0) {
            uVar29 = 0;
          }
          else {
            uVar29 = *(ushort *)(pFVar11 + uVar29);
          }
          if (uVar29 < uVar23) {
            uVar23 = *(ushort *)(table + ((ulong)uVar29 - lVar13));
          }
          else {
            uVar23 = 0;
          }
          if (uVar23 == 0) {
            pTVar19 = (Table *)0x0;
          }
          else {
            pTVar19 = table + (ulong)*(uint *)(table + uVar23) + (ulong)uVar23;
          }
          if (uVar5 < 7) {
            uVar23 = 0;
          }
          else {
            uVar23 = *(ushort *)(pFVar11 + lVar10 + 6);
          }
          if (uVar23 == 0) {
            pFVar16 = (Field *)0x0;
          }
          else {
            pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar23) + (ulong)uVar23;
          }
          uVar26 = 0;
          uVar22 = 0;
          if (6 < *(ushort *)(pFVar16 + -(long)*(int *)pFVar16)) {
            uVar22 = (ulong)*(ushort *)(pFVar16 + (6 - (long)*(int *)pFVar16));
          }
          if ((short)uVar22 != 0) {
            uVar26 = (uint)(char)pFVar16[uVar22].super_Table;
          }
          if (uVar26 == 0xf) {
            if (*(ushort *)(local_a0 + -(long)*(int *)local_a0) < 5) {
              uVar23 = 0;
            }
            else {
              uVar23 = *(ushort *)(local_a0 + (4 - (long)*(int *)local_a0));
            }
            if (uVar23 == 0) {
              pSVar27 = (Schema *)0x0;
            }
            else {
              pSVar27 = local_a0 + (ulong)*(uint *)(local_a0 + uVar23) + (ulong)uVar23;
            }
            if (uVar5 < 7) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + lVar10 + 6);
            }
            if (uVar5 == 0) {
              pFVar11 = (Field *)0x0;
            }
            else {
              pFVar11 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar5) + (ulong)uVar5;
            }
            if (*(ushort *)(pFVar11 + -(long)*(int *)pFVar11) < 9) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + (8 - (long)*(int *)pFVar11));
            }
            if (uVar5 == 0) {
              uVar6 = 0xffffffff;
            }
            else {
              uVar6 = *(uint *)(pFVar11 + uVar5);
            }
            if (*(uint *)pSVar27 <= uVar6) goto LAB_0014cb29;
            pOVar30 = (Object *)
                      (pSVar27 +
                      (ulong)*(uint *)(pSVar27 + (ulong)(uVar6 << 2) + 4) + (ulong)(uVar6 << 2) + 4)
            ;
          }
          else {
            pOVar30 = (Object *)0x0;
          }
          local_48 = pTVar19;
          if (uVar26 == 0xf) {
            if (*(ushort *)(pOVar30 + -(long)*(int *)pOVar30) < 9) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pOVar30 + (8 - (long)*(int *)pOVar30));
            }
            if ((uVar5 != 0) && (pOVar30[uVar5].super_Table != (Table)0x0)) goto LAB_0014c4a7;
            std::
            vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
            ::vector((vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                      *)&local_80,(ulong)*(uint *)pTVar19,(allocator_type *)&local_a1);
            pTVar20 = local_48;
            if (*(uint *)pTVar19 != 0) {
              uVar31 = 0;
              uVar22 = 0;
              do {
                OVar8 = CopyTable(local_90,local_a0,pOVar30,
                                  pTVar20 + (ulong)*(uint *)(pTVar20 + (uVar31 & 0xffffffff) + 4) +
                                            (uVar31 & 0xffffffff) + 4,use_string_pooling_00);
                *(offset_type *)
                 ((long)&(local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->o + uVar31) = OVar8.o;
                uVar22 = uVar22 + 1;
                uVar31 = uVar31 + 4;
              } while (uVar22 < *(uint *)local_48);
            }
            fbb = local_90;
            pOVar21 = local_80.
                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)local_80.
                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_80.
                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0) {
              pOVar21 = (pointer)&data<flatbuffers::Offset<flatbuffers::Table_const*>,std::allocator<flatbuffers::Offset<flatbuffers::Table_const*>>>(std::vector<flatbuffers::Offset<flatbuffers::Table_const*>,std::allocator<flatbuffers::Offset<flatbuffers::Table_const*>>>const&)
                                  ::t;
            }
            local_a8 = (uint)FlatBufferBuilderImpl<false>::CreateVector<flatbuffers::Table_const*>
                                       (local_90,(Offset<const_flatbuffers::Table_*> *)pOVar21,
                                        (long)local_80.
                                              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_80.
                                              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2);
          }
          else {
            if (uVar26 != 0xd) {
LAB_0014c4a7:
              sVar15 = (&GetTypeSize(reflection::BaseType)::sizes)[uVar26];
              sVar28 = sVar15;
              if (pOVar30 != (Object *)0x0) {
                lVar13 = -(long)*(int *)pOVar30;
                if (*(ushort *)(pOVar30 + -(long)*(int *)pOVar30) < 9) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = *(ushort *)(pOVar30 + lVar13 + 8);
                }
                if ((uVar5 != 0) && (pOVar30[uVar5].super_Table != (Table)0x0)) {
                  if (*(ushort *)(pOVar30 + -(long)*(int *)pOVar30) < 0xd) {
                    uVar5 = 0;
                  }
                  else {
                    uVar5 = *(ushort *)(pOVar30 + lVar13 + 0xc);
                  }
                  if (uVar5 == 0) {
                    sVar28 = 0;
                  }
                  else {
                    sVar28 = (size_t)*(int *)(pOVar30 + uVar5);
                  }
                }
              }
              FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                        (fbb,(ulong)*(uint *)pTVar19,sVar28,sVar15);
              sVar28 = sVar28 * *(uint *)pTVar19;
              if (sVar28 != 0) {
                vector_downward<unsigned_int>::ensure_space(&fbb->buf_,sVar28);
                __dest = (fbb->buf_).cur_ + -sVar28;
                (fbb->buf_).cur_ = __dest;
                puVar1 = &(fbb->buf_).size_;
                *puVar1 = *puVar1 + (int)sVar28;
                memcpy(__dest,pTVar19 + 4,sVar28);
              }
              local_a8 = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                                   (fbb,(ulong)*(uint *)pTVar19);
              pOVar30 = pOVar3;
              break;
            }
            std::
            vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
            ::vector(&local_80,(ulong)*(uint *)pTVar19,&local_a1);
            if (*(uint *)pTVar19 != 0) {
              uVar31 = 0;
              uVar22 = 0;
              pTVar20 = pTVar19;
              do {
                pFVar4 = local_90;
                uVar12 = uVar31 & 0xffffffff;
                if ((char)local_84 == '\0') {
                  FlatBufferBuilderImpl<false>::CreateStringImpl
                            (local_90,(char *)(pTVar19 + (ulong)*(uint *)(pTVar19 + uVar12 + 4) +
                                                         uVar12 + 4 + 4),
                             (ulong)*(uint *)(pTVar19 +
                                             (ulong)*(uint *)(pTVar19 + uVar12 + 4) + uVar12 + 4));
                  OVar7.o = (pFVar4->buf_).size_;
                  pTVar20 = local_48;
                }
                else {
                  OVar7 = FlatBufferBuilderImpl<false>::CreateSharedString
                                    (local_90,(char *)(pTVar19 + (ulong)*(uint *)(pTVar19 +
                                                                                 uVar12 + 4) +
                                                                 uVar12 + 4 + 4),
                                     (ulong)*(uint *)(pTVar19 +
                                                     (ulong)*(uint *)(pTVar19 + uVar12 + 4) +
                                                     uVar12 + 4));
                }
                *(offset_type *)
                 ((long)&(local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->o + uVar31) = OVar7.o;
                uVar22 = uVar22 + 1;
                uVar31 = uVar31 + 4;
              } while (uVar22 < *(uint *)pTVar20);
            }
            fbb = local_90;
            pOVar21 = local_80.
                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)local_80.
                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_80.
                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0) {
              pOVar21 = (pointer)&data<flatbuffers::Offset<flatbuffers::String_const*>,std::allocator<flatbuffers::Offset<flatbuffers::String_const*>>>(std::vector<flatbuffers::Offset<flatbuffers::String_const*>,std::allocator<flatbuffers::Offset<flatbuffers::String_const*>>>const&)
                                  ::t;
            }
            local_a8 = (uint)FlatBufferBuilderImpl<false>::CreateVector<flatbuffers::String_const*>
                                       (local_90,pOVar21,
                                        (long)local_80.
                                              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_80.
                                              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2);
          }
          pOVar30 = local_98;
          if (local_80.
              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (Offset<const_flatbuffers::String_*> *)0x0) {
            operator_delete(local_80.
                            super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_80.
                                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.
                                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          break;
        case 0xf:
          if (*(ushort *)(local_a0 + -(long)*(int *)local_a0) < 5) {
            uVar29 = 0;
          }
          else {
            uVar29 = *(ushort *)(local_a0 + (4 - (long)*(int *)local_a0));
          }
          if (uVar29 == 0) {
            pSVar27 = (Schema *)0x0;
          }
          else {
            pSVar27 = local_a0 + (ulong)*(uint *)(local_a0 + uVar29) + (ulong)uVar29;
          }
          if (uVar5 < 7) {
            uVar29 = 0;
          }
          else {
            uVar29 = *(ushort *)(pFVar11 + lVar10 + 6);
          }
          if (uVar29 == 0) {
            pFVar16 = (Field *)0x0;
          }
          else {
            pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar29) + (ulong)uVar29;
          }
          if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 9) {
            uVar29 = 0;
          }
          else {
            uVar29 = *(ushort *)(pFVar16 + (8 - (long)*(int *)pFVar16));
          }
          if (uVar29 == 0) {
            uVar26 = 0xffffffff;
          }
          else {
            uVar26 = *(uint *)(pFVar16 + uVar29);
          }
          if (*(uint *)pSVar27 <= uVar26) goto LAB_0014cb29;
          lVar32 = (ulong)*(uint *)(pSVar27 + (ulong)(uVar26 << 2) + 4) + (ulong)(uVar26 << 2);
          pOVar14 = (Object *)(pSVar27 + lVar32 + 4);
          if (*(ushort *)(pOVar14 + -(long)*(int *)pOVar14) < 9) {
            uVar29 = 0;
          }
          else {
            uVar29 = *(ushort *)(pSVar27 + ((lVar32 + 0xc) - (long)*(int *)pOVar14));
          }
          if ((uVar29 == 0) || (pOVar14[uVar29].super_Table == (Table)0x0)) {
            if (uVar5 < 7) {
              uVar29 = 0;
            }
            else {
              uVar29 = *(ushort *)(pFVar11 + lVar10 + 6);
            }
            if (uVar29 == 0) {
              pFVar16 = (Field *)0x0;
            }
            else {
              pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar29) + (ulong)uVar29;
            }
            if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 5) {
              uVar29 = 0;
            }
            else {
              uVar29 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
            }
            if ((uVar29 == 0) || (pFVar16[uVar29].super_Table != (Table)0xf)) {
              if (uVar5 < 7) {
                uVar29 = 0;
              }
              else {
                uVar29 = *(ushort *)(pFVar11 + lVar10 + 6);
              }
              if (uVar29 == 0) {
                pFVar16 = (Field *)0x0;
              }
              else {
                pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar29) + (ulong)uVar29;
              }
              if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 5) {
                uVar29 = 0;
              }
              else {
                uVar29 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
              }
              if ((uVar29 == 0) || (pFVar16[uVar29].super_Table != (Table)0x10)) goto LAB_0014cb48;
            }
            if (uVar5 < 0xb) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + lVar10 + 10);
            }
            if (uVar5 == 0) {
              uVar5 = 0;
            }
            else {
              uVar5 = *(ushort *)(pFVar11 + uVar5);
            }
            if (uVar5 < uVar23) {
              uVar5 = *(ushort *)(table + ((ulong)uVar5 - lVar13));
            }
            else {
              uVar5 = 0;
            }
            local_a8 = (uint)CopyTable(fbb,local_a0,pOVar14,
                                       table + (ulong)*(uint *)(table + uVar5) + (ulong)uVar5,
                                       (bool)(char)local_84);
          }
          break;
        case 0x10:
          pOVar14 = GetUnionType(local_a0,local_50,pFVar11,table);
          lVar13 = -(long)*(int *)pFVar11;
          uVar5 = *(ushort *)(pFVar11 + -(long)*(int *)pFVar11);
          if (uVar5 < 7) {
            uVar23 = 0;
          }
          else {
            uVar23 = *(ushort *)(pFVar11 + lVar13 + 6);
          }
          if (uVar23 == 0) {
            pFVar16 = (Field *)0x0;
          }
          else {
            pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar23) + (ulong)uVar23;
          }
          if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 5) {
            uVar23 = 0;
          }
          else {
            uVar23 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
          }
          if ((uVar23 == 0) || (pFVar16[uVar23].super_Table != (Table)0xf)) {
            if (uVar5 < 7) {
              uVar23 = 0;
            }
            else {
              uVar23 = *(ushort *)(pFVar11 + lVar13 + 6);
            }
            if (uVar23 == 0) {
              pFVar16 = (Field *)0x0;
            }
            else {
              pFVar16 = pFVar11 + (ulong)*(uint *)(pFVar11 + uVar23) + (ulong)uVar23;
            }
            if (*(ushort *)(pFVar16 + -(long)*(int *)pFVar16) < 5) {
              uVar23 = 0;
            }
            else {
              uVar23 = *(ushort *)(pFVar16 + (4 - (long)*(int *)pFVar16));
            }
            if ((uVar23 == 0) || (pFVar16[uVar23].super_Table != (Table)0x10)) {
LAB_0014cb48:
              __assert_fail("field.type()->base_type() == reflection::Obj || field.type()->base_type() == reflection::Union"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                            ,0xa2,
                            "Table *flatbuffers::GetFieldT(const Table &, const reflection::Field &)"
                           );
            }
          }
          if (uVar5 < 0xb) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ushort *)(pFVar11 + lVar13 + 10);
          }
          if (uVar5 == 0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ushort *)(pFVar11 + uVar5);
          }
          if (uVar5 < *(ushort *)(table + -(long)*(int *)table)) {
            uVar5 = *(ushort *)(table + ((ulong)uVar5 - (long)*(int *)table));
          }
          else {
            uVar5 = 0;
          }
          local_a8 = (uint)CopyTable(fbb,local_a0,pOVar14,
                                     table + (ulong)*(uint *)(table + uVar5) + (ulong)uVar5,
                                     use_string_pooling_00);
        }
        if (local_a8 != 0) {
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                       &local_a8);
          }
          else {
            *iStack_60._M_current = local_a8;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
      }
      pOVar14 = local_38 + 4;
    } while (pOVar14 != local_40 + (*(uint *)pOVar30 << 2));
  }
  lVar13 = -(long)*(int *)local_50;
  if (*(ushort *)(local_50 + -(long)*(int *)local_50) < 9) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(local_50 + lVar13 + 8);
  }
  if ((uVar5 == 0) || (local_50[uVar5].super_Table == (Table)0x0)) {
    FlatBufferBuilderImpl<false>::NotNested(fbb);
    fbb->nested = true;
  }
  else {
    if (*(ushort *)(local_50 + -(long)*(int *)local_50) < 0xb) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(local_50 + lVar13 + 10);
    }
    if (uVar5 == 0) {
      uVar22 = 0;
    }
    else {
      uVar22 = (ulong)*(int *)(local_50 + uVar5);
    }
    if (fbb->minalign_ < uVar22) {
      fbb->minalign_ = uVar22;
    }
    vector_downward<unsigned_int>::fill(&fbb->buf_,uVar22 - 1 & -(ulong)(fbb->buf_).size_);
  }
  uVar9 = (fbb->buf_).size_;
  if ((*(uint *)pOVar30 & 0x3fffffff) == 0) {
    lVar13 = 0;
  }
  else {
    lVar10 = 4;
    lVar32 = 0xe;
    lVar13 = 0;
    do {
      uVar22 = (ulong)*(uint *)(pOVar30 + lVar10);
      lVar17 = uVar22 - (long)*(int *)(pOVar30 + lVar10 + uVar22);
      uVar5 = *(ushort *)(pOVar30 + lVar32 + -10 + lVar17);
      if (uVar5 < 0xb) {
        uVar23 = 0;
      }
      else {
        uVar23 = *(ushort *)(pOVar30 + lVar32 + lVar17);
      }
      if (uVar23 == 0) {
        uVar23 = 0;
      }
      else {
        uVar23 = *(ushort *)(local_98 + lVar10 + uVar22 + uVar23);
      }
      if ((*(ushort *)(table + -(long)*(int *)table) <= uVar23) ||
         (*(short *)(table + ((ulong)uVar23 - (long)*(int *)table)) == 0)) goto LAB_0014ca22;
      if (uVar5 < 7) {
        uVar23 = 0;
      }
      else {
        uVar23 = *(ushort *)(pOVar30 + lVar32 + -4 + lVar17);
      }
      if (uVar23 == 0) {
        pOVar14 = (Object *)0x0;
      }
      else {
        pOVar14 = local_98 +
                  (ulong)*(uint *)(local_98 + lVar10 + uVar23 + uVar22) + uVar23 + uVar22 + lVar10;
      }
      uVar26 = 0;
      uVar23 = 0;
      if (4 < *(ushort *)(pOVar14 + -(long)*(int *)pOVar14)) {
        uVar23 = *(ushort *)(pOVar14 + (4 - (long)*(int *)pOVar14));
      }
      if (uVar23 != 0) {
        uVar26 = (uint)(char)pOVar14[uVar23].super_Table;
      }
      if (uVar26 - 0xd < 2) {
LAB_0014c9cf:
        if (*(ushort *)
             (local_98 + lVar32 + -10 + (uVar22 - (long)*(int *)(pOVar30 + lVar10 + uVar22))) < 0xb)
        {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)
                   (local_98 + lVar32 + (uVar22 - (long)*(int *)(pOVar30 + lVar10 + uVar22)));
        }
        if (uVar5 == 0) {
          field = 0;
        }
        else {
          field = *(voffset_t *)(local_98 + lVar10 + uVar22 + uVar5);
        }
        FlatBufferBuilderImpl<false>::AddOffset<void>
                  (local_90,field,(Offset<void>)*(offset_type *)((long)local_68 + lVar13 * 4));
        lVar13 = lVar13 + 1;
      }
      else if (uVar26 == 0xf) {
        if (*(ushort *)(local_a0 + -(long)*(int *)local_a0) < 5) {
          uVar23 = 0;
        }
        else {
          uVar23 = *(ushort *)(local_a0 + (4 - (long)*(int *)local_a0));
        }
        if (uVar23 == 0) {
          pSVar27 = (Schema *)0x0;
        }
        else {
          pSVar27 = local_a0 + (ulong)*(uint *)(local_a0 + uVar23) + (ulong)uVar23;
        }
        if (uVar5 < 7) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)(pOVar30 + lVar32 + -4 + lVar17);
        }
        if (uVar5 == 0) {
          pOVar14 = (Object *)0x0;
        }
        else {
          pOVar14 = local_98 +
                    (ulong)*(uint *)(local_98 + lVar10 + uVar5 + uVar22) + uVar5 + uVar22 + lVar10;
        }
        if (*(ushort *)(pOVar14 + -(long)*(int *)pOVar14) < 9) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)(pOVar14 + (8 - (long)*(int *)pOVar14));
        }
        if (uVar5 == 0) {
          uVar26 = 0xffffffff;
        }
        else {
          uVar26 = *(uint *)(pOVar14 + uVar5);
        }
        if (*(uint *)pSVar27 <= uVar26) {
LAB_0014cb29:
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                       );
        }
        lVar17 = (ulong)*(uint *)(pSVar27 + (ulong)(uVar26 << 2) + 4) + (ulong)(uVar26 << 2);
        pSVar18 = pSVar27 + lVar17 + 4;
        lVar24 = -(long)*(int *)pSVar18;
        uVar5 = *(ushort *)(pSVar18 + -(long)*(int *)pSVar18);
        if (uVar5 < 9) {
          uVar23 = 0;
        }
        else {
          uVar23 = *(ushort *)(pSVar27 + lVar24 + lVar17 + 0xc);
        }
        if ((uVar23 == 0) || (pSVar18[uVar23].super_Table == (Table)0x0)) goto LAB_0014c9cf;
        if (uVar5 < 0xb) {
          uVar23 = 0;
        }
        else {
          uVar23 = *(ushort *)(pSVar27 + lVar24 + lVar17 + 0xe);
        }
        if (uVar23 == 0) {
          sVar15 = 0;
        }
        else {
          sVar15 = (size_t)*(int *)(pSVar18 + uVar23);
        }
        if (uVar5 < 0xd) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)(pSVar27 + lVar24 + lVar17 + 0x10);
        }
        if (uVar5 == 0) {
          sVar28 = 0;
        }
        else {
          sVar28 = (size_t)*(int *)(pSVar18 + uVar5);
        }
        anon_unknown_101::CopyInline
                  (local_90,(Field *)(local_98 + uVar22 + lVar10),table,sVar15,sVar28);
      }
      else {
        if (uVar26 == 0x10) goto LAB_0014c9cf;
        anon_unknown_101::CopyInline
                  (local_90,(Field *)(local_98 + uVar22 + lVar10),table,
                   (&GetTypeSize(reflection::BaseType)::sizes)[uVar26],
                   (&GetTypeSize(reflection::BaseType)::sizes)[uVar26]);
      }
LAB_0014ca22:
      lVar32 = lVar32 + 4;
      lVar17 = lVar10 + 4;
      lVar10 = lVar10 + 4;
      pOVar30 = local_98;
    } while (local_98 + lVar17 != local_40 + (*(uint *)local_98 << 2));
  }
  if (lVar13 != (long)iStack_60._M_current - (long)local_68 >> 2) {
    __assert_fail("offset_idx == offsets.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                  ,0x2e6,
                  "Offset<const Table *> flatbuffers::CopyTable(FlatBufferBuilder &, const reflection::Schema &, const reflection::Object &, const Table &, bool)"
                 );
  }
  if (*(ushort *)(local_50 + -(long)*(int *)local_50) < 9) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(local_50 + (8 - (long)*(int *)local_50));
  }
  if ((uVar5 == 0) || (local_50[uVar5].super_Table == (Table)0x0)) {
    uVar9 = FlatBufferBuilderImpl<false>::EndTable(local_90,uVar9);
  }
  else {
    uVar9 = (local_90->buf_).size_;
    ppuVar2 = &(local_90->buf_).scratch_;
    *ppuVar2 = *ppuVar2 + (ulong)local_90->num_field_loc * -8;
    local_90->num_field_loc = 0;
    local_90->max_voffset_ = 0;
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return (Offset<const_flatbuffers::Table_*>)uVar9;
}

Assistant:

Offset<const Table *> CopyTable(FlatBufferBuilder &fbb,
                                const reflection::Schema &schema,
                                const reflection::Object &objectdef,
                                const Table &table, bool use_string_pooling) {
  // Before we can construct the table, we have to first generate any
  // subobjects, and collect their offsets.
  std::vector<uoffset_t> offsets;
  auto fielddefs = objectdef.fields();
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    // Skip if field is not present in the source.
    if (!table.CheckField(fielddef.offset())) continue;
    uoffset_t offset = 0;
    switch (fielddef.type()->base_type()) {
      case reflection::String: {
        offset = use_string_pooling
                     ? fbb.CreateSharedString(GetFieldS(table, fielddef)).o
                     : fbb.CreateString(GetFieldS(table, fielddef)).o;
        break;
      }
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (!subobjectdef.is_struct()) {
          offset = CopyTable(fbb, schema, subobjectdef,
                             *GetFieldT(table, fielddef), use_string_pooling)
                       .o;
        }
        break;
      }
      case reflection::Union: {
        auto &subobjectdef = GetUnionType(schema, objectdef, fielddef, table);
        offset = CopyTable(fbb, schema, subobjectdef,
                           *GetFieldT(table, fielddef), use_string_pooling)
                     .o;
        break;
      }
      case reflection::Vector: {
        auto vec =
            table.GetPointer<const Vector<Offset<Table>> *>(fielddef.offset());
        auto element_base_type = fielddef.type()->element();
        auto elemobjectdef =
            element_base_type == reflection::Obj
                ? schema.objects()->Get(fielddef.type()->index())
                : nullptr;
        switch (element_base_type) {
          case reflection::String: {
            std::vector<Offset<const String *>> elements(vec->size());
            auto vec_s = reinterpret_cast<const Vector<Offset<String>> *>(vec);
            for (uoffset_t i = 0; i < vec_s->size(); i++) {
              elements[i] = use_string_pooling
                                ? fbb.CreateSharedString(vec_s->Get(i)).o
                                : fbb.CreateString(vec_s->Get(i)).o;
            }
            offset = fbb.CreateVector(elements).o;
            break;
          }
          case reflection::Obj: {
            if (!elemobjectdef->is_struct()) {
              std::vector<Offset<const Table *>> elements(vec->size());
              for (uoffset_t i = 0; i < vec->size(); i++) {
                elements[i] = CopyTable(fbb, schema, *elemobjectdef,
                                        *vec->Get(i), use_string_pooling);
              }
              offset = fbb.CreateVector(elements).o;
              break;
            }
          }
            FLATBUFFERS_FALLTHROUGH();  // fall thru
          default: {                    // Scalars and structs.
            auto element_size = GetTypeSize(element_base_type);
            auto element_alignment = element_size;  // For primitive elements
            if (elemobjectdef && elemobjectdef->is_struct())
              element_size = elemobjectdef->bytesize();
            fbb.StartVector(vec->size(), element_size, element_alignment);
            fbb.PushBytes(vec->Data(), element_size * vec->size());
            offset = fbb.EndVector(vec->size());
            break;
          }
        }
        break;
      }
      default:  // Scalars.
        break;
    }
    if (offset) { offsets.push_back(offset); }
  }
  // Now we can build the actual table from either offsets or scalar data.
  auto start = objectdef.is_struct() ? fbb.StartStruct(objectdef.minalign())
                                     : fbb.StartTable();
  size_t offset_idx = 0;
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    if (!table.CheckField(fielddef.offset())) continue;
    auto base_type = fielddef.type()->base_type();
    switch (base_type) {
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (subobjectdef.is_struct()) {
          CopyInline(fbb, fielddef, table, subobjectdef.minalign(),
                     subobjectdef.bytesize());
          break;
        }
      }
        FLATBUFFERS_FALLTHROUGH();  // fall thru
      case reflection::Union:
      case reflection::String:
      case reflection::Vector:
        fbb.AddOffset(fielddef.offset(), Offset<void>(offsets[offset_idx++]));
        break;
      default: {  // Scalars.
        auto size = GetTypeSize(base_type);
        CopyInline(fbb, fielddef, table, size, size);
        break;
      }
    }
  }
  FLATBUFFERS_ASSERT(offset_idx == offsets.size());
  if (objectdef.is_struct()) {
    fbb.ClearOffsets();
    return fbb.EndStruct();
  } else {
    return fbb.EndTable(start);
  }
}